

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall
glslang::HlslGrammar::acceptSelectionStatement
          (HlslGrammar *this,TIntermNode **statement,TAttributes *attributes)

{
  int *piVar1;
  HlslParseContext *this_00;
  TIntermNodePair nodePair;
  bool bVar2;
  int iVar3;
  TIntermSelection *pTVar4;
  undefined4 extraout_var;
  char *syntax;
  TIntermTyped *condition;
  TIntermNodePair thenElse;
  TSourceLoc loc;
  
  loc.column = (this->super_HlslTokenStream).token.loc.column;
  loc._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
  loc.name = (this->super_HlslTokenStream).token.loc.name;
  loc.string = (this->super_HlslTokenStream).token.loc.string;
  loc.line = (this->super_HlslTokenStream).token.loc.line;
  bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokIf);
  if (bVar2) {
    HlslParseContext::pushScope(this->parseContext);
    bVar2 = acceptParenExpression(this,&condition);
    if ((bVar2) &&
       (condition = HlslParseContext::convertConditionalExpression
                              (this->parseContext,&loc,condition,true),
       condition != (TIntermTyped *)0x0)) {
      thenElse.node1 = (TIntermNode *)0x0;
      thenElse.node2 = (TIntermNode *)0x0;
      piVar1 = &(this->parseContext->super_TParseContextBase).controlFlowNestingLevel;
      *piVar1 = *piVar1 + 1;
      bVar2 = acceptScopedStatement(this,&thenElse.node1);
      if (bVar2) {
        bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokElse);
        if ((!bVar2) || (bVar2 = acceptScopedStatement(this,&thenElse.node2), bVar2)) {
          nodePair.node2 = thenElse.node2;
          nodePair.node1 = thenElse.node1;
          pTVar4 = TIntermediate::addSelection(this->intermediate,condition,nodePair,&loc);
          *statement = (TIntermNode *)pTVar4;
          this_00 = this->parseContext;
          iVar3 = (*(pTVar4->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[9])(pTVar4);
          HlslParseContext::handleSelectionAttributes
                    (this_00,&loc,(TIntermSelection *)CONCAT44(extraout_var,iVar3),attributes);
          HlslParseContext::popScope(this->parseContext);
          piVar1 = &(this->parseContext->super_TParseContextBase).controlFlowNestingLevel;
          *piVar1 = *piVar1 + -1;
          return true;
        }
        syntax = "else statement";
      }
      else {
        syntax = "then statement";
      }
      expected(this,syntax);
    }
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptSelectionStatement(TIntermNode*& statement, const TAttributes& attributes)
{
    TSourceLoc loc = token.loc;

    // IF
    if (! acceptTokenClass(EHTokIf))
        return false;

    // so that something declared in the condition is scoped to the lifetimes
    // of the then-else statements
    parseContext.pushScope();

    // LEFT_PAREN expression RIGHT_PAREN
    TIntermTyped* condition;
    if (! acceptParenExpression(condition))
        return false;
    condition = parseContext.convertConditionalExpression(loc, condition);
    if (condition == nullptr)
        return false;

    // create the child statements
    TIntermNodePair thenElse = { nullptr, nullptr };

    ++parseContext.controlFlowNestingLevel;  // this only needs to work right if no errors

    // then statement
    if (! acceptScopedStatement(thenElse.node1)) {
        expected("then statement");
        return false;
    }

    // ELSE
    if (acceptTokenClass(EHTokElse)) {
        // else statement
        if (! acceptScopedStatement(thenElse.node2)) {
            expected("else statement");
            return false;
        }
    }

    // Put the pieces together
    statement = intermediate.addSelection(condition, thenElse, loc);
    parseContext.handleSelectionAttributes(loc, statement->getAsSelectionNode(), attributes);

    parseContext.popScope();
    --parseContext.controlFlowNestingLevel;

    return true;
}